

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

void __thiscall TPZCheckMesh::DependencyReport(TPZCheckMesh *this,int connect)

{
  ostream *poVar1;
  TPZCompElSide large;
  TPZCompElSide TStack_28;
  
  poVar1 = std::operator<<(this->fOut,"DependencyReport for connect ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,connect);
  std::endl<char,std::char_traits<char>>(poVar1);
  FindElement((TPZCheckMesh *)&TStack_28,(int)this);
  DependencyReport(this,connect,&TStack_28);
  return;
}

Assistant:

void TPZCheckMesh::DependencyReport(int connect) {
	
	(*fOut) << "DependencyReport for connect " << connect << endl;
	TPZCompElSide large = FindElement(connect);
	DependencyReport(connect, large);
}